

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O2

void RVO::linearProgram3(vector<RVO::Line,_std::allocator<RVO::Line>_> *lines,size_t numObstLines,
                        size_t beginLine,float radius,Vector2 *result)

{
  undefined8 uVar1;
  __normal_iterator<const_RVO::Line_*,_std::vector<RVO::Line,_std::allocator<RVO::Line>_>_> __first;
  pointer pLVar2;
  Vector2 VVar3;
  pointer pLVar4;
  size_t sVar5;
  long lVar6;
  size_t j;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  value_type local_78;
  float local_68;
  float local_64;
  Vector2 *local_60;
  long local_58;
  ulong local_50;
  vector<RVO::Line,_std::allocator<RVO::Line>_> projLines;
  
  local_58 = numObstLines << 4;
  fVar10 = 0.0;
  local_68 = radius;
  local_60 = result;
  local_50 = numObstLines;
  do {
    lVar6 = local_58;
    __first._M_current =
         (lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
         super__Vector_impl_data._M_start;
    if ((ulong)((long)(lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)__first._M_current >> 4) <=
        beginLine) {
      return;
    }
    if (fVar10 < (__first._M_current[beginLine].point.y_ - result->y_) *
                 __first._M_current[beginLine].direction.x_ -
                 (__first._M_current[beginLine].point.x_ - result->x_) *
                 __first._M_current[beginLine].direction.y_) {
      std::vector<RVO::Line,std::allocator<RVO::Line>>::
      vector<__gnu_cxx::__normal_iterator<RVO::Line_const*,std::vector<RVO::Line,std::allocator<RVO::Line>>>,void>
                ((vector<RVO::Line,std::allocator<RVO::Line>> *)&projLines,__first,
                 (Line *)((long)&((__first._M_current)->point).x_ + local_58),
                 (allocator_type *)&local_78);
      for (uVar7 = local_50; result = local_60, uVar7 < beginLine; uVar7 = uVar7 + 1) {
        local_78.direction.x_ = 0.0;
        local_78.direction.y_ = 0.0;
        pLVar2 = (lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pLVar4 = pLVar2 + beginLine;
        fVar10 = *(float *)((long)&(pLVar2->direction).x_ + lVar6);
        fVar9 = *(float *)((long)&(pLVar2->direction).y_ + lVar6);
        fVar11 = pLVar2[beginLine].direction.x_;
        fVar8 = pLVar2[beginLine].direction.y_;
        fVar12 = fVar11 * fVar9 - fVar10 * fVar8;
        if (ABS(fVar12) <= 1e-05) {
          if (fVar11 * fVar10 + fVar9 * fVar8 <= 0.0) {
            uVar1 = *(undefined8 *)((long)&(pLVar2->point).x_ + lVar6);
            local_78.point.x_ = ((float)uVar1 + (pLVar4->point).x_) * 0.5;
            local_78.point.y_ = ((float)((ulong)uVar1 >> 0x20) + (pLVar4->point).y_) * 0.5;
            goto LAB_00107668;
          }
        }
        else {
          fVar13 = (pLVar4->point).x_;
          fVar14 = (pLVar4->point).y_;
          fVar12 = (fVar10 * (fVar14 - *(float *)((long)&(pLVar2->point).y_ + lVar6)) -
                   (fVar13 - *(float *)((long)&(pLVar2->point).x_ + lVar6)) * fVar9) / fVar12;
          local_78.point.x_ = fVar11 * fVar12 + fVar13;
          local_78.point.y_ = fVar8 * fVar12 + fVar14;
LAB_00107668:
          uVar1 = *(undefined8 *)((long)&(pLVar2->direction).x_ + lVar6);
          fVar10 = (float)uVar1 - (pLVar4->direction).x_;
          fVar9 = (float)((ulong)uVar1 >> 0x20) - (pLVar4->direction).y_;
          fVar11 = 1.0 / SQRT(fVar10 * fVar10 + fVar9 * fVar9);
          local_78.direction.y_ = fVar11 * fVar9;
          local_78.direction.x_ = fVar11 * fVar10;
          std::vector<RVO::Line,_std::allocator<RVO::Line>_>::push_back(&projLines,&local_78);
        }
        lVar6 = lVar6 + 0x10;
      }
      VVar3 = *local_60;
      pLVar4 = (lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_78.point =
           (Vector2)(CONCAT44(pLVar4[beginLine].direction.x_,pLVar4[beginLine].direction.y_) ^
                    0x80000000);
      sVar5 = linearProgram2(&projLines,local_68,&local_78.point,true,local_60);
      if (sVar5 < (ulong)((long)projLines.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)projLines.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 4)) {
        *result = VVar3;
        fVar10 = VVar3.x_;
        fVar9 = VVar3.y_;
      }
      else {
        fVar10 = result->x_;
        fVar9 = result->y_;
      }
      pLVar4 = (lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_64 = (pLVar4[beginLine].point.y_ - fVar9) * pLVar4[beginLine].direction.x_ -
                 (pLVar4[beginLine].point.x_ - fVar10) * pLVar4[beginLine].direction.y_;
      std::_Vector_base<RVO::Line,_std::allocator<RVO::Line>_>::~_Vector_base
                ((_Vector_base<RVO::Line,_std::allocator<RVO::Line>_> *)&projLines);
      fVar10 = local_64;
    }
    beginLine = beginLine + 1;
  } while( true );
}

Assistant:

void linearProgram3(const std::vector<Line> &lines, size_t numObstLines, size_t beginLine, float radius, Vector2 &result)
	{
		float distance = 0.0f;

		for (size_t i = beginLine; i < lines.size(); ++i) {
			if (det(lines[i].direction, lines[i].point - result) > distance) {
				/* Result does not satisfy constraint of line i. */
				std::vector<Line> projLines(lines.begin(), lines.begin() + static_cast<ptrdiff_t>(numObstLines));

				for (size_t j = numObstLines; j < i; ++j) {
					Line line;

					float determinant = det(lines[i].direction, lines[j].direction);

					if (std::fabs(determinant) <= RVO_EPSILON) {
						/* Line i and line j are parallel. */
						if (lines[i].direction * lines[j].direction > 0.0f) {
							/* Line i and line j point in the same direction. */
							continue;
						}
						else {
							/* Line i and line j point in opposite direction. */
							line.point = 0.5f * (lines[i].point + lines[j].point);
						}
					}
					else {
						line.point = lines[i].point + (det(lines[j].direction, lines[i].point - lines[j].point) / determinant) * lines[i].direction;
					}

					line.direction = normalize(lines[j].direction - lines[i].direction);
					projLines.push_back(line);
				}

				const Vector2 tempResult = result;

				if (linearProgram2(projLines, radius, Vector2(-lines[i].direction.y(), lines[i].direction.x()), true, result) < projLines.size()) {
					/* This should in principle not happen.  The result is by definition
					 * already in the feasible region of this linear program. If it fails,
					 * it is due to small floating point error, and the current result is
					 * kept.
					 */
					result = tempResult;
				}

				distance = det(lines[i].direction, lines[i].point - result);
			}
		}
	}